

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_suite.cpp
# Opt level: O3

void initialization_suite::init_zero(void)

{
  basic_iterator<int> first_end;
  basic_iterator<int> first_end_00;
  basic_iterator<int> first_end_01;
  basic_iterator<int> first_end_02;
  basic_iterator<int> first_begin;
  basic_iterator<int> first_begin_00;
  basic_iterator<int> first_begin_01;
  basic_iterator<int> first_begin_02;
  array<int,_4UL> array;
  circular_view<int,_18446744073709551615UL> span;
  type local_68 [6];
  circular_view<int,_18446744073709551615UL> local_50;
  
  local_68[0] = 0xb;
  local_68[1] = 0x16;
  local_68[2] = 0x21;
  local_68[3] = 0x2c;
  local_50.member.cap = 4;
  local_50.member.size = 0;
  local_50.member.next = 0;
  first_end.current = 0;
  first_end.parent = &local_50;
  first_begin.current = 0;
  first_begin.parent = &local_50;
  local_50.member.data = local_68;
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x8fe,"void initialization_suite::init_zero()",first_begin,first_end,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)0x0,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)0x0);
  local_50.member.cap = 4;
  local_50.member.size = 0;
  local_50.member.next = 1;
  first_end_00.current = 1;
  first_end_00.parent = &local_50;
  first_begin_00.current = 1;
  first_begin_00.parent = &local_50;
  local_50.member.data = local_68;
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x905,"void initialization_suite::init_zero()",first_begin_00,first_end_00,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)0x0,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)0x0);
  local_50.member.cap = 4;
  local_50.member.size = 0;
  local_50.member.next = 2;
  first_end_01.current = 2;
  first_end_01.parent = &local_50;
  first_begin_01.current = 2;
  first_begin_01.parent = &local_50;
  local_50.member.data = local_68;
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x90c,"void initialization_suite::init_zero()",first_begin_01,first_end_01,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)0x0,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)0x0);
  local_50.member.cap = 4;
  local_50.member.size = 0;
  local_50.member.next = 3;
  first_end_02.current = 3;
  first_end_02.parent = &local_50;
  first_begin_02.current = 3;
  first_begin_02.parent = &local_50;
  local_50.member.data = local_68;
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x913,"void initialization_suite::init_zero()",first_begin_02,first_end_02,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)0x0,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)0x0);
  return;
}

Assistant:

void init_zero()
{
    std::array<int, 4> array = { 11, 22, 33, 44 };
    {
        circular_view<int> span(array.begin(), array.end(), array.begin(), 0);

        std::vector<int> expect = {};
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
    }
    {
        circular_view<int> span(array.begin(), array.end(), std::next(array.begin(), 1), 0);

        std::vector<int> expect = {};
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
    }
    {
        circular_view<int> span(array.begin(), array.end(), std::next(array.begin(), 2), 0);

        std::vector<int> expect = {};
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
    }
    {
        circular_view<int> span(array.begin(), array.end(), std::next(array.begin(), 3), 0);

        std::vector<int> expect = {};
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
    }
}